

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O2

void __thiscall
iu_Variant_x_iutest_x_CompareRawType_Test::Body(iu_Variant_x_iutest_x_CompareRawType_Test *this)

{
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1e8;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  _Variadic_union<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190 [12];
  
  v.
  super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._M_u._M_first.
  _M_storage = (_Uninitialized<int,_true>)1;
  v.
  super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  local_190[0]._0_4_ =
       v.
       super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._M_u._M_first.
       _M_storage;
  iutest::internal::CmpHelperEQ<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13fce4,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x7e,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperEQ<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","1",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x7f,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 0;
  iutest::internal::CmpHelperNE<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13e327,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x80,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 0;
  iutest::internal::CmpHelperNE<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","0",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x81,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperLE<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13fce4,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x82,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperLE<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","1",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x83,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 0;
  iutest::internal::CmpHelperLT<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13e327,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x84,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 2;
  iutest::internal::CmpHelperLT<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","2",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x85,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperGE<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13fce4,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x86,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperGE<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","1",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x87,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 2;
  iutest::internal::CmpHelperGT<int,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)0x13e268,"v",(char *)local_190,(int *)&v,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x88,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_190[0]._M_first._M_storage = 0;
  iutest::internal::CmpHelperGT<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","0",(char *)&v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190[0]._M_first,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x89,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e8,(Fixed *)&local_190[0]._M_first);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__detail::__variant::
  _Variant_storage<false,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&v);
  return;
}

Assistant:

IUTEST(Variant, CompareRawType)
{
    ::std::variant<int, float, ::std::string> v = 1;
    IUTEST_EXPECT_EQ(1, v);
    IUTEST_EXPECT_EQ(v, 1);
    IUTEST_EXPECT_NE(0, v);
    IUTEST_EXPECT_NE(v, 0);
    IUTEST_EXPECT_LE(1, v);
    IUTEST_EXPECT_LE(v, 1);
    IUTEST_EXPECT_LT(0, v);
    IUTEST_EXPECT_LT(v, 2);
    IUTEST_EXPECT_GE(1, v);
    IUTEST_EXPECT_GE(v, 1);
    IUTEST_EXPECT_GT(2, v);
    IUTEST_EXPECT_GT(v, 0);
}